

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O1

void __thiscall
TestRegenerateCmakeAddSubdirectory_NoSubDirs::Run
          (TestRegenerateCmakeAddSubdirectory_NoSubDirs *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  runtime_error *this_00;
  bool bVar4;
  string expectedOutput;
  TemporaryWorkingDirectory workdir;
  ostringstream oss;
  Component comp;
  undefined1 *local_450;
  size_t local_448;
  undefined1 local_440 [16];
  undefined1 *local_430;
  size_t local_428;
  undefined1 local_420 [16];
  TemporaryWorkingDirectory local_410;
  undefined1 local_3d0 [376];
  Component local_258;
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory(&local_410,(this->super_Test).name);
  pcVar1 = local_3d0 + 0x10;
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"MyComponent","");
  paVar2 = &local_258.root.m_pathname.field_2;
  local_258.root.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_410.workDir.m_pathname._M_dataplus._M_p,
             local_410.workDir.m_pathname._M_dataplus._M_p +
             local_410.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=(&local_258.root,(path *)local_3d0);
  boost::filesystem::detail::create_directories(&local_258.root,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.root.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.root.m_pathname._M_dataplus._M_p);
  }
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_);
  }
  local_3d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"./MyComponent/","");
  Component::Component(&local_258,(path *)local_3d0);
  if ((pointer)local_3d0._0_8_ != pcVar1) {
    operator_delete((void *)local_3d0._0_8_);
  }
  local_450 = local_440;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d0);
  RegenerateCmakeAddSubdirectory((ostream *)local_3d0,&local_258);
  std::__cxx11::stringbuf::str();
  if (local_428 == local_448) {
    if (local_428 == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_430,local_450,local_428);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_430 != local_420) {
    operator_delete(local_430);
  }
  if (bVar4) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d0);
    std::ios_base::~ios_base((ios_base *)(local_3d0 + 0x70));
    if (local_450 != local_440) {
      operator_delete(local_450);
    }
    Component::~Component(&local_258);
    TemporaryWorkingDirectory::~TemporaryWorkingDirectory(&local_410);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_NoSubDirs) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");

  Component comp("./MyComponent/");

  const std::string expectedOutput("");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}